

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grand.c
# Opt level: O1

guint32 g_rand_int(GRand *rand)

{
  uint uVar1;
  long lVar2;
  
  if (0x26f < rand->mti) {
    lVar2 = 0;
    do {
      rand->mt[lVar2] =
           g_rand_int::mag01[rand->mt[lVar2 + 1] & 1] ^ rand->mt[lVar2 + 0x18d] ^
           (rand->mt[lVar2 + 1] & 0x7ffffffe | rand->mt[lVar2] & 0x80000000) >> 1;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0xe3);
    lVar2 = 0xe4;
    do {
      rand->mt[lVar2 + -1] =
           g_rand_int::mag01[rand->mt[lVar2] & 1] ^ *(uint *)((long)rand + lVar2 * 4 + -0x390) ^
           (rand->mt[lVar2] & 0x7ffffffe | rand->mt[lVar2 + -1] & 0x80000000) >> 1;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x270);
    rand->mt[0x26f] =
         g_rand_int::mag01[rand->mt[0] & 1] ^ rand->mt[0x18c] ^
         (rand->mt[0] & 0x7ffffffe | rand->mt[0x26f] & 0x80000000) >> 1;
    rand->mti = 0;
  }
  uVar1 = rand->mti;
  rand->mti = uVar1 + 1;
  uVar1 = rand->mt[uVar1] >> 0xb ^ rand->mt[uVar1];
  uVar1 = (uVar1 & 0x13a58ad) << 7 ^ uVar1;
  uVar1 = (uVar1 & 0x1df8c) << 0xf ^ uVar1;
  return uVar1 >> 0x12 ^ uVar1;
}

Assistant:

guint32 g_rand_int (GRand *rand)
{
    guint32 y;
    static const guint32 mag01[2]={0x0, MATRIX_A};
    /* mag01[x] = x * MATRIX_A  for x=0,1 */

    g_return_val_if_fail (rand != NULL, 0);

    if (rand->mti >= N) { /* generate N words at one time */
        int kk;

        for (kk = 0; kk < N - M; kk++) {
            y = (rand->mt[kk]&UPPER_MASK)|(rand->mt[kk+1]&LOWER_MASK);
            rand->mt[kk] = rand->mt[kk+M] ^ (y >> 1) ^ mag01[y & 0x1];
        }
        for (; kk < N - 1; kk++) {
            y = (rand->mt[kk]&UPPER_MASK)|(rand->mt[kk+1]&LOWER_MASK);
            rand->mt[kk] = rand->mt[kk+(M-N)] ^ (y >> 1) ^ mag01[y & 0x1];
        }
        y = (rand->mt[N-1]&UPPER_MASK)|(rand->mt[0]&LOWER_MASK);
        rand->mt[N-1] = rand->mt[M-1] ^ (y >> 1) ^ mag01[y & 0x1];

        rand->mti = 0;
    }

    y = rand->mt[rand->mti++];
    y ^= TEMPERING_SHIFT_U(y);
    y ^= TEMPERING_SHIFT_S(y) & TEMPERING_MASK_B;
    y ^= TEMPERING_SHIFT_T(y) & TEMPERING_MASK_C;
    y ^= TEMPERING_SHIFT_L(y);

    return y; 
}